

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::MergeUpdateInfo<short>(UpdateInfo *current,short *result_data)

{
  sel_t *psVar1;
  short *__src;
  void *in_RSI;
  long in_RDI;
  idx_t i;
  short *info_data;
  sel_t *tuples;
  ulong local_28;
  
  psVar1 = UpdateInfo::GetTuples((UpdateInfo *)0xbbc888);
  __src = UpdateInfo::GetData<short>((UpdateInfo *)0xbbc897);
  if (*(int *)(in_RDI + 0x20) == 0x800) {
    memcpy(in_RSI,__src,(ulong)*(uint *)(in_RDI + 0x20) << 1);
  }
  else {
    for (local_28 = 0; local_28 < *(uint *)(in_RDI + 0x20); local_28 = local_28 + 1) {
      *(short *)((long)in_RSI + (ulong)psVar1[local_28] * 2) = __src[local_28];
    }
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}